

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Span.h
# Opt level: O3

vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> * __thiscall
jaegertracing::Span::tags
          (vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *__return_storage_ptr__,
          Span *this)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)(this + 0x168));
  if (iVar1 == 0) {
    std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::vector
              (__return_storage_ptr__,
               (vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)(this + 0x120));
    pthread_mutex_unlock((pthread_mutex_t *)(this + 0x168));
    return __return_storage_ptr__;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

std::vector<Tag> tags() const
    {
        std::lock_guard<std::mutex> lock(_mutex);
        return _tags;
    }